

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzplane.cpp
# Opt level: O3

bool __thiscall
TPZPlane::Belongs(TPZPlane *this,TPZVec<double> *ponto1,TPZVec<double> *ponto2,
                 TPZVec<double> *ponto3)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  long lVar5;
  char cVar6;
  double dVar7;
  TPZVec<double> aux1;
  TPZVec<double> aux2;
  TPZVec<double> local_98;
  TPZVec<double> local_78;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  
  pdVar1 = (this->fCoef).fStore;
  dVar7 = 0.0;
  lVar5 = 0;
  do {
    dVar7 = dVar7 + ponto1->fStore[lVar5] * pdVar1[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  local_48 = pdVar1[3];
  local_38 = ABS(dVar7 + local_48);
  dVar7 = 0.0;
  lVar5 = 0;
  do {
    dVar7 = dVar7 + ponto2->fStore[lVar5] * pdVar1[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  uStack_30 = 0;
  uStack_40 = 0;
  local_58 = ABS(dVar7 + local_48);
  uStack_50 = 0;
  dVar7 = 0.0;
  lVar5 = 0;
  do {
    dVar7 = dVar7 + ponto3->fStore[lVar5] * pdVar1[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  TPZVec<double>::TPZVec(&local_98,3);
  TPZVec<double>::TPZVec(&local_78,3);
  cVar6 = (ABS(local_48 + dVar7) < 9e-06) + (local_58 < 9e-06) + (local_38 < 9e-06);
  if (cVar6 == '\x03') {
    pdVar1 = ponto1->fStore;
    pdVar2 = ponto2->fStore;
    pdVar3 = ponto3->fStore;
    lVar5 = 0;
    do {
      local_98.fStore[lVar5] = (pdVar1[lVar5] - pdVar2[lVar5]) * 100.0;
      local_78.fStore[lVar5] = (pdVar2[lVar5] - pdVar3[lVar5]) * 100.0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    TPZNumeric::ProdVetorial<double>(&local_98,&local_78,&local_98);
    lVar5 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + (uint)(ABS(local_98.fStore[lVar5]) < 9e-07);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    if (iVar4 == 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "TPZPlane::Belongs(p1, p2, p3) - Warning: The 3 input points are colinear\n",0x49);
    }
  }
  local_78._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_78.fStore != (double *)0x0) {
    operator_delete__(local_78.fStore);
  }
  local_98._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  if (local_98.fStore != (double *)0x0) {
    operator_delete__(local_98.fStore);
  }
  return cVar6 == '\x03';
}

Assistant:

bool TPZPlane::Belongs(const TPZVec<REAL> &ponto1, const TPZVec<REAL> &ponto2, const TPZVec<REAL> &ponto3){
	int aux=0;
	int i;
	aux = aux + Belongs(ponto1);
	aux = aux + Belongs(ponto2);
	aux = aux + Belongs(ponto3);
	TPZVec<REAL> aux1(3), aux2(3);
    // Verify if the points are colinear
	if(aux==3) {
		for(i=0;i<3;i++) {
			aux1[i]=100.*(ponto1[i]-ponto2[i]);
			aux2[i]=100.*(ponto2[i]-ponto3[i]);
		}
		// Verify if the displacement vectors have the same direction
		aux=0;
		TPZNumeric::ProdVetorial(aux1, aux2, aux1);
		for(i=0;i<3;i++) {
			if(fabs(aux1[i])<0.0000009) aux++;
		}
		if(aux==3) {
			cout << "TPZPlane::Belongs(p1, p2, p3) - Warning: The 3 input points are colinear\n";
		}
		return true;
	}
	else return false;
}